

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hereticweaps.cpp
# Opt level: O3

int AF_A_FloatPuff(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  PClass *pPVar4;
  undefined4 in_register_00000014;
  ulong uVar5;
  VMValue *pVVar6;
  char *__assertion;
  undefined8 *puVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  uVar5 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005ce6f1;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar7 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar7 == (undefined8 *)0x0) {
LAB_005ce60e:
        puVar7 = (undefined8 *)0x0;
        pVVar6 = param;
      }
      else {
        auVar10._8_8_ = uVar5;
        auVar10._0_8_ = puVar7[1];
        if (puVar7[1] == 0) {
          auVar10 = (**(code **)*puVar7)(puVar7);
          puVar7[1] = auVar10._0_8_;
        }
        pPVar4 = auVar10._0_8_;
        bVar8 = pPVar4 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar8;
        uVar5 = (ulong)bVar8;
        bVar9 = pPVar4 == pPVar3;
        if (!bVar9 && !bVar8) {
          do {
            pPVar4 = pPVar4->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar4 != (PClass *)0x0);
            if (pPVar4 == pPVar3) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        pVVar6 = (VMValue *)(ulong)(bVar9 || bVar8);
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005ce6f1;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005ce6bc;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005ce6e1;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar4 = (PClass *)puVar2[1];
            if (pPVar4 == (PClass *)0x0) {
              pPVar4 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar6,uVar5,ret);
              puVar2[1] = pPVar4;
            }
            bVar8 = pPVar4 != (PClass *)0x0;
            if (pPVar4 != pPVar3 && bVar8) {
              do {
                pPVar4 = pPVar4->ParentClass;
                bVar8 = pPVar4 != (PClass *)0x0;
                if (pPVar4 == pPVar3) break;
              } while (pPVar4 != (PClass *)0x0);
            }
            if (!bVar8) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005ce6f1;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005ce6e1;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005ce6bc:
        puVar7[0x17] = (double)puVar7[0x17] + 1.8;
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005ce6f1;
    }
    if (puVar7 == (undefined8 *)0x0) goto LAB_005ce60e;
  }
LAB_005ce6e1:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005ce6f1:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                ,0x56b,"int AF_A_FloatPuff(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FloatPuff)
{
	PARAM_ACTION_PROLOGUE;

	self->Vel.Z += 1.8;
	return 0;
}